

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

Curl_addrinfo * Curl_unix2addr(char *path,_Bool *longpath,_Bool abstract)

{
  undefined2 *puVar1;
  void *pvVar2;
  size_t __n;
  ulong __n_00;
  size_t path_len;
  sockaddr_un *sa_un;
  Curl_addrinfo *ai;
  _Bool abstract_local;
  _Bool *longpath_local;
  char *path_local;
  
  *longpath = false;
  path_local = (char *)(*Curl_ccalloc)(1,0x30);
  if (path_local == (char *)0x0) {
    path_local = (char *)0x0;
  }
  else {
    pvVar2 = (*Curl_ccalloc)(1,0x6e);
    *(void **)(path_local + 0x20) = pvVar2;
    if (*(long *)(path_local + 0x20) == 0) {
      (*Curl_cfree)(path_local);
      path_local = (char *)0x0;
    }
    else {
      puVar1 = *(undefined2 **)(path_local + 0x20);
      *puVar1 = 1;
      __n = strlen(path);
      __n_00 = __n + 1;
      if (__n_00 < 0x6d) {
        path_local[4] = '\x01';
        path_local[5] = '\0';
        path_local[6] = '\0';
        path_local[7] = '\0';
        path_local[8] = '\x01';
        path_local[9] = '\0';
        path_local[10] = '\0';
        path_local[0xb] = '\0';
        *(uint *)(path_local + 0x10) = (int)__n_00 + 2U & 0x7fffffff;
        if (abstract) {
          memcpy((void *)((long)puVar1 + 3),path,__n);
        }
        else {
          memcpy(puVar1 + 1,path,__n_00);
        }
      }
      else {
        (*Curl_cfree)(*(void **)(path_local + 0x20));
        (*Curl_cfree)(path_local);
        *longpath = true;
        path_local = (char *)0x0;
      }
    }
  }
  return (Curl_addrinfo *)path_local;
}

Assistant:

Curl_addrinfo *Curl_unix2addr(const char *path, bool *longpath, bool abstract)
{
  Curl_addrinfo *ai;
  struct sockaddr_un *sa_un;
  size_t path_len;

  *longpath = FALSE;

  ai = calloc(1, sizeof(Curl_addrinfo));
  if(!ai)
    return NULL;
  ai->ai_addr = calloc(1, sizeof(struct sockaddr_un));
  if(!ai->ai_addr) {
    free(ai);
    return NULL;
  }

  sa_un = (void *) ai->ai_addr;
  sa_un->sun_family = AF_UNIX;

  /* sun_path must be able to store the NUL-terminated path */
  path_len = strlen(path) + 1;
  if(path_len > sizeof(sa_un->sun_path)) {
    free(ai->ai_addr);
    free(ai);
    *longpath = TRUE;
    return NULL;
  }

  ai->ai_family = AF_UNIX;
  ai->ai_socktype = SOCK_STREAM; /* assume reliable transport for HTTP */
  ai->ai_addrlen = (curl_socklen_t)
    ((offsetof(struct sockaddr_un, sun_path) + path_len) & 0x7FFFFFFF);

  /* Abstract Unix domain socket have NULL prefix instead of suffix */
  if(abstract)
    memcpy(sa_un->sun_path + 1, path, path_len - 1);
  else
    memcpy(sa_un->sun_path, path, path_len); /* copy NUL byte */

  return ai;
}